

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageCracker.h
# Opt level: O2

void __thiscall
FIX::MessageCracker::crack
          (MessageCracker *this,Message *message,SessionID *sessionID,ApplVerID *applVerID)

{
  bool bVar1;
  string *__lhs;
  
  __lhs = &(applVerID->super_StringField).super_FieldBase.m_string;
  bVar1 = std::operator==(__lhs,"2");
  if (bVar1) {
    FIX40::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
  }
  bVar1 = std::operator==(__lhs,"3");
  if (bVar1) {
    FIX41::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
  }
  bVar1 = std::operator==(__lhs,"4");
  if (bVar1) {
    FIX42::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
  }
  bVar1 = std::operator==(__lhs,"5");
  if (bVar1) {
    FIX43::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
  }
  bVar1 = std::operator==(__lhs,"6");
  if (bVar1) {
    FIX44::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
  }
  bVar1 = std::operator==(__lhs,"7");
  if (bVar1) {
    FIX50::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
  }
  bVar1 = std::operator==(__lhs,"8");
  if (bVar1) {
    FIX50SP1::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
  }
  bVar1 = std::operator==(__lhs,"9");
  if (bVar1) {
    FIX50SP2::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
    return;
  }
  return;
}

Assistant:

void crack(const Message &message, const SessionID &sessionID, const ApplVerID &applVerID) {
    if (applVerID == ApplVerID_FIX40) {
      ((FIX40::MessageCracker &)(*this)).crack((const FIX40::Message &)message, sessionID);
    }
    if (applVerID == ApplVerID_FIX41) {
      ((FIX41::MessageCracker &)(*this)).crack((const FIX41::Message &)message, sessionID);
    }
    if (applVerID == ApplVerID_FIX42) {
      ((FIX42::MessageCracker &)(*this)).crack((const FIX42::Message &)message, sessionID);
    }
    if (applVerID == ApplVerID_FIX43) {
      ((FIX43::MessageCracker &)(*this)).crack((const FIX43::Message &)message, sessionID);
    }
    if (applVerID == ApplVerID_FIX44) {
      ((FIX44::MessageCracker &)(*this)).crack((const FIX44::Message &)message, sessionID);
    }
    if (applVerID == ApplVerID_FIX50) {
      ((FIX50::MessageCracker &)(*this)).crack((const FIX50::Message &)message, sessionID);
    }
    if (applVerID == ApplVerID_FIX50_SP1) {
      ((FIX50SP1::MessageCracker &)(*this)).crack((const FIX50SP1::Message &)message, sessionID);
    }
    if (applVerID == ApplVerID_FIX50_SP2) {
      ((FIX50SP2::MessageCracker &)(*this)).crack((const FIX50SP2::Message &)message, sessionID);
    }
  }